

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisualElement.cpp
# Opt level: O0

shared_ptr<iDynTree::XMLElement> __thiscall
iDynTree::VisualElement::childElementForName(VisualElement *this,string *name)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  element_type *in_RDI;
  shared_ptr<iDynTree::XMLElement> sVar3;
  shared_ptr<iDynTree::MaterialElement> ptr;
  MaterialElement *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  shared_ptr<iDynTree::MaterialElement::MaterialInfo> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  XMLParserState *in_stack_ffffffffffffff98;
  shared_ptr<iDynTree::SolidShape> *in_stack_ffffffffffffffa0;
  XMLParserState *in_stack_ffffffffffffffa8;
  shared_ptr<iDynTree::MaterialElement::MaterialInfo> local_48 [4];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  bVar1 = std::operator==(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  if (bVar1) {
    iDynTree::XMLElement::getParserState();
    std::make_shared<iDynTree::OriginElement,iDynTree::XMLParserState&,iDynTree::Transform&>
              (in_stack_ffffffffffffff98,(Transform *)in_stack_ffffffffffffff90);
    std::shared_ptr<iDynTree::XMLElement>::shared_ptr<iDynTree::OriginElement,void>
              ((shared_ptr<iDynTree::XMLElement> *)in_stack_ffffffffffffff70,
               (shared_ptr<iDynTree::OriginElement> *)in_stack_ffffffffffffff68);
    std::shared_ptr<iDynTree::OriginElement>::~shared_ptr
              ((shared_ptr<iDynTree::OriginElement> *)0x1b9f80);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    if (bVar1) {
      iDynTree::XMLElement::getParserState();
      std::
      make_shared<iDynTree::GeometryElement,iDynTree::XMLParserState&,std::shared_ptr<iDynTree::SolidShape>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff98);
      std::shared_ptr<iDynTree::XMLElement>::shared_ptr<iDynTree::GeometryElement,void>
                ((shared_ptr<iDynTree::XMLElement> *)in_stack_ffffffffffffff70,
                 (shared_ptr<iDynTree::GeometryElement> *)in_stack_ffffffffffffff68);
      std::shared_ptr<iDynTree::GeometryElement>::~shared_ptr
                ((shared_ptr<iDynTree::GeometryElement> *)0x1b9fe9);
      _Var2._M_pi = extraout_RDX_00;
    }
    else {
      bVar1 = std::operator==(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
      if (bVar1) {
        iDynTree::XMLElement::getParserState();
        this_00 = local_48;
        std::make_shared<iDynTree::MaterialElement,iDynTree::XMLParserState&,decltype(nullptr)>
                  (in_stack_ffffffffffffff98,(void **)in_stack_ffffffffffffff90);
        std::
        __shared_ptr_access<iDynTree::MaterialElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<iDynTree::MaterialElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1ba03f);
        MaterialElement::materialInfo(in_stack_ffffffffffffff68);
        std::shared_ptr<iDynTree::MaterialElement::MaterialInfo>::operator=
                  (this_00,(shared_ptr<iDynTree::MaterialElement::MaterialInfo> *)
                           in_stack_ffffffffffffff68);
        std::shared_ptr<iDynTree::MaterialElement::MaterialInfo>::~shared_ptr
                  ((shared_ptr<iDynTree::MaterialElement::MaterialInfo> *)0x1ba072);
        std::shared_ptr<iDynTree::XMLElement>::shared_ptr<iDynTree::MaterialElement,void>
                  ((shared_ptr<iDynTree::XMLElement> *)this_00,
                   (shared_ptr<iDynTree::MaterialElement> *)in_stack_ffffffffffffff68);
        std::shared_ptr<iDynTree::MaterialElement>::~shared_ptr
                  ((shared_ptr<iDynTree::MaterialElement> *)0x1ba08b);
        _Var2._M_pi = extraout_RDX_01;
      }
      else {
        iDynTree::XMLElement::getParserState();
        sVar3 = std::
                make_shared<iDynTree::XMLElement,iDynTree::XMLParserState&,std::__cxx11::string_const&>
                          (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        _Var2 = sVar3.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      }
    }
  }
  sVar3.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<iDynTree::XMLElement>)
         sVar3.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<iDynTree::XMLElement> VisualElement::childElementForName(const std::string& name) {
        if (name == "origin") {
            return std::make_shared<OriginElement>(getParserState(), m_info.m_origin);
        } else if (name == "geometry") {
            return std::make_shared<GeometryElement>(
                getParserState(), m_info.m_solidShape, m_info.m_packageDirs);
        } else if (name == "material") {
            auto ptr = std::make_shared<MaterialElement>(getParserState(), nullptr);
            m_info.m_material = ptr->materialInfo();
            return ptr;
        }
        return std::make_shared<XMLElement>(getParserState(), name);
    }